

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ReceivedServerConnect(Curl_easy *data,_Bool *received)

{
  dynbuf *s;
  curl_socket_t readfd0;
  curl_socket_t readfd1;
  connectdata *pcVar1;
  CURLcode CVar2;
  uint uVar3;
  timediff_t tVar4;
  size_t sVar5;
  char *pcVar6;
  int ftpcode;
  ssize_t nread;
  int local_3c;
  ssize_t local_38;
  
  pcVar1 = data->conn;
  readfd0 = pcVar1->sock[0];
  readfd1 = pcVar1->sock[1];
  *received = false;
  tVar4 = ftp_timeleft_accept(data);
  if (((data->set).field_0x8bd & 0x10) != 0) {
    Curl_infof(data,"Checking for server connect");
  }
  if (tVar4 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }
  s = &(pcVar1->proto).ftpc.pp.recvbuf;
  sVar5 = Curl_dyn_len(s);
  if ((sVar5 == 0) || (pcVar6 = Curl_dyn_ptr(s), *pcVar6 < '4')) {
    if ((pcVar1->proto).ftpc.pp.overflow == 0) {
      uVar3 = Curl_socket_check(readfd0,readfd1,-1,0);
      if (uVar3 == 0) {
        return CURLE_OK;
      }
      if (uVar3 == 0xffffffff) {
        Curl_failf(data,"Error while waiting for server connect");
        goto LAB_00691b35;
      }
      if ((uVar3 & 8) != 0) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Ready to accept data connection from server");
        }
        *received = true;
        return CURLE_OK;
      }
      if ((uVar3 & 1) == 0) {
        return CURLE_OK;
      }
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"Ctrl conn has data while waiting for data conn");
    }
    Curl_GetFTPResponse(data,&local_38,&local_3c);
    CVar2 = (uint)(399 < local_3c) * 2 + CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"There is negative response in cache while serv connect");
    }
    Curl_GetFTPResponse(data,&local_38,&local_3c);
LAB_00691b35:
    CVar2 = CURLE_FTP_ACCEPT_FAILED;
  }
  return CVar2;
}

Assistant:

static CURLcode ReceivedServerConnect(struct Curl_easy *data, bool *received)
{
  struct connectdata *conn = data->conn;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int socketstate = 0;
  timediff_t timeout_ms;
  ssize_t nread;
  int ftpcode;
  bool response = FALSE;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(Curl_dyn_len(&pp->recvbuf) && (*Curl_dyn_ptr(&pp->recvbuf) > '3')) {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  if(pp->overflow)
    /* there is pending control data still in the buffer to read */
    response = TRUE;
  else
    socketstate = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(socketstate) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:
    if(socketstate & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server");
      *received = TRUE;
    }
    else if(socketstate & CURL_CSELECT_IN)
      response = TRUE;
    break;
  }
  if(response) {
    infof(data, "Ctrl conn has data while waiting for data conn");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);

    if(ftpcode/100 > 3)
      return CURLE_FTP_ACCEPT_FAILED;

    return CURLE_WEIRD_SERVER_REPLY;
  }

  return CURLE_OK;
}